

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

string * __thiscall
ScrollPanel::writeXml_abi_cxx11_(string *__return_storage_ptr__,ScrollPanel *this,int indent)

{
  int indent_00;
  pointer pcVar1;
  char cVar2;
  string *psVar3;
  ostream *poVar4;
  stringstream str;
  char *local_300;
  long local_2f8;
  char local_2f0 [16];
  string *local_2e0;
  string local_2d8;
  string local_2b8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Util::getIndent_abi_cxx11_(0);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_300,local_2f8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<ScrollPanel",0xc);
  if (local_300 != local_2f0) {
    operator_delete(local_300);
  }
  Widget::writeXmlAttributes(&this->super_Widget,(stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,">",1);
  cVar2 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"PanelX","");
  indent_00 = indent + 1;
  Util::writeXmlElement<float>((stringstream *)local_1b8,indent_00,&local_1d8,this->panelX);
  local_2e0 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"PanelY","");
  Util::writeXmlElement<float>((stringstream *)local_1b8,indent_00,&local_1f8,this->panelY);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"PanelWidth","");
  Util::writeXmlElement<float>((stringstream *)local_1b8,indent_00,&local_218,this->panelWidth);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"PanelHeight","");
  Util::writeXmlElement<float>((stringstream *)local_1b8,indent_00,&local_238,this->panelHeight);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"PanelName","");
  pcVar1 = (this->panelName)._M_dataplus._M_p;
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,pcVar1,pcVar1 + (this->panelName)._M_string_length);
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1b8,indent_00,&local_258,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"HorizontalScroll","");
  Util::writeXmlElement<bool>((stringstream *)local_1b8,indent_00,&local_298,this->horizontalScroll)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"VerticalScroll","");
  Util::writeXmlElement<bool>((stringstream *)local_1b8,indent_00,&local_2b8,this->verticalScroll);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"ScrollBarVisibility","");
  Util::writeXmlElement<ScrollBarVisibility>
            ((stringstream *)local_1b8,indent_00,&local_2d8,this->scrollBarVisibility);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  Widget::writeXmlChildren(&this->super_Widget,(stringstream *)local_1b8,indent_00);
  psVar3 = local_2e0;
  Util::getIndent_abi_cxx11_(0);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_300,local_2f8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</ScrollPanel>",0xe);
  if (local_300 != local_2f0) {
    operator_delete(local_300);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string ScrollPanel::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<ScrollPanel";
	writeXmlAttributes(str);
	str << ">" << std::endl;

	Util::writeXmlElement(str, indent + 1, "PanelX", panelX);
	Util::writeXmlElement(str, indent + 1, "PanelY", panelY);
	Util::writeXmlElement(str, indent + 1, "PanelWidth", panelWidth);
	Util::writeXmlElement(str, indent + 1, "PanelHeight", panelHeight);
	Util::writeXmlElement(str, indent + 1, "PanelName", panelName);
	Util::writeXmlElement(str, indent + 1, "HorizontalScroll", horizontalScroll);
	Util::writeXmlElement(str, indent + 1, "VerticalScroll", verticalScroll);
	Util::writeXmlElement(str, indent + 1, "ScrollBarVisibility", scrollBarVisibility);

	writeXmlChildren(str, indent + 1);

	str << Util::getIndent(indent) << "</ScrollPanel>";
	return str.str();
}